

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>::vector<float*>
          (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *this,float *first,float *last,
          polymorphic_allocator<float> *alloc)

{
  undefined8 *in_RCX;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_RDX;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_RSI;
  polymorphic_allocator<float> *in_RDI;
  float *iter;
  size_t i;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *local_30;
  long local_28;
  
  in_RDI->memoryResource = (memory_resource *)*in_RCX;
  in_RDI[1].memoryResource = (memory_resource *)0x0;
  in_RDI[2].memoryResource = (memory_resource *)0x0;
  in_RDI[3].memoryResource = (memory_resource *)0x0;
  local_30 = in_RSI;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_>::reserve(in_RSI,(size_t)in_RDX);
  local_28 = 0;
  for (; local_30 != in_RDX;
      local_30 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                 ((long)&(local_30->alloc).memoryResource + 4)) {
    pmr::polymorphic_allocator<float>::construct<float,float&>
              (in_RDI,(float *)((long)&(in_RDI[1].memoryResource)->_vptr_memory_resource +
                               local_28 * 4),(float *)local_30);
    local_28 = local_28 + 1;
  }
  in_RDI[3].memoryResource = in_RDI[2].memoryResource;
  return;
}

Assistant:

vector(InputIt first, InputIt last, const Allocator &alloc = {}) : alloc(alloc) {
        reserve(last - first);
        size_t i = 0;
        for (InputIt iter = first; iter != last; ++iter, ++i)
            this->alloc.template construct<T>(ptr + i, *iter);
        nStored = nAlloc;
    }